

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O0

Interval * __thiscall
tcu::FloatFormat::convert(Interval *__return_storage_ptr__,FloatFormat *this,Interval *x)

{
  bool bVar1;
  float fVar2;
  double dVar3;
  Interval local_a8;
  Interval local_90;
  Interval local_78;
  Interval local_60;
  Interval local_48;
  undefined1 local_30 [8];
  Interval tmp;
  Interval *x_local;
  FloatFormat *this_local;
  
  tmp.m_hi = (double)x;
  Interval::Interval(__return_storage_ptr__);
  local_30 = *(undefined1 (*) [8])tmp.m_hi;
  tmp._0_8_ = *(undefined8 *)((long)tmp.m_hi + 8);
  tmp.m_lo = *(double *)((long)tmp.m_hi + 0x10);
  bVar1 = Interval::hasNaN((Interval *)tmp.m_hi);
  if (bVar1) {
    if (this->m_hasNaN != NO) {
      fVar2 = std::numeric_limits<float>::quiet_NaN();
      Interval::Interval(&local_48,(double)fVar2);
      Interval::operator|=(__return_storage_ptr__,&local_48);
    }
    if (this->m_hasNaN != YES) {
      Interval::unbounded(&local_60,false);
      local_30 = (undefined1  [8])local_60._0_8_;
      tmp._0_8_ = local_60.m_lo;
      tmp.m_lo = local_60.m_hi;
    }
  }
  bVar1 = Interval::empty((Interval *)local_30);
  if (!bVar1) {
    dVar3 = Interval::lo((Interval *)local_30);
    dVar3 = round(this,dVar3);
    clampValue(&local_90,this,dVar3);
    dVar3 = Interval::hi((Interval *)local_30);
    dVar3 = round(this,dVar3);
    clampValue(&local_a8,this,dVar3);
    Interval::operator|(&local_78,&local_90,&local_a8);
    Interval::operator|=(__return_storage_ptr__,&local_78);
  }
  if ((this->m_exactPrecision & 1U) == 0) {
    Interval::operator|=(__return_storage_ptr__,(Interval *)tmp.m_hi);
  }
  return __return_storage_ptr__;
}

Assistant:

Interval FloatFormat::convert (const Interval& x) const
{
	Interval ret;
	Interval tmp = x;

	if (x.hasNaN())
	{
		// If NaN might be supported, NaN is a legal return value
		if (m_hasNaN != NO)
			ret |= TCU_NAN;

		// If NaN might not be supported, any (non-NaN) value is legal,
		// _subject_ to clamping. Hence we modify tmp, not ret.
		if (m_hasNaN != YES)
			tmp = Interval::unbounded();
	}

	// Round both bounds _inwards_ to closest representable values.
	if (!tmp.empty())
		ret |= clampValue(round(tmp.lo(), true)) | clampValue(round(tmp.hi(), false));

	// If this format's precision is not exact, the (possibly out-of-bounds)
	// original value is also a possible result.
	if (!m_exactPrecision)
		ret |= x;

	return ret;
}